

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

void * lyplg_type_print_uint
                 (ly_ctx *UNUSED_ctx,lyd_value *value,LY_VALUE_FORMAT format,
                 void *UNUSED_prefix_data,ly_bool *dynamic,size_t *value_len)

{
  LY_DATA_TYPE LVar1;
  size_t __n;
  size_t sVar2;
  void *__dest;
  anon_union_24_16_e2776397_for_lyd_value_2 *__s;
  ulong local_30;
  
  local_30 = 0;
  if (format == LY_VALUE_LYB) {
    LVar1 = value->realtype->basetype;
    switch(LVar1) {
    case LY_TYPE_UINT8:
      local_30 = (ulong)(value->field_2).uint8;
      break;
    case LY_TYPE_UINT16:
      local_30 = (ulong)(value->field_2).uint16;
      break;
    case LY_TYPE_UINT32:
      local_30 = (ulong)(value->field_2).uint32;
      break;
    case LY_TYPE_UINT64:
      local_30 = (value->field_2).dec64;
    }
    if (local_30 != (value->field_2).dec64) {
      __dest = calloc(1,integer_lyb_size[LVar1]);
      if (__dest != (void *)0x0) {
        *dynamic = '\x01';
        __n = integer_lyb_size[value->realtype->basetype];
        if (value_len != (size_t *)0x0) {
          *value_len = __n;
        }
        memcpy(__dest,&local_30,__n);
        return __dest;
      }
      return (void *)0x0;
    }
    __s = &value->field_2;
    *dynamic = '\0';
    if (value_len == (size_t *)0x0) {
      return __s;
    }
    sVar2 = integer_lyb_size[value->realtype->basetype];
  }
  else {
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    __s = (anon_union_24_16_e2776397_for_lyd_value_2 *)value->_canonical;
    if (value_len == (size_t *)0x0) {
      return __s;
    }
    sVar2 = strlen(&__s->boolean);
  }
  *value_len = sVar2;
  return __s;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_uint(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    uint64_t num = 0;
    void *buf;

    if (format == LY_VALUE_LYB) {
        switch (value->realtype->basetype) {
        case LY_TYPE_UINT8:
            num = value->uint8;
            break;
        case LY_TYPE_UINT16:
            num = value->uint16;
            break;
        case LY_TYPE_UINT32:
            num = value->uint32;
            break;
        case LY_TYPE_UINT64:
            num = value->uint64;
            break;
        default:
            break;
        }
        num = htole64(num);
        if (num == value->uint64) {
            /* values are equal, little-endian or uint8 */
            *dynamic = 0;
            if (value_len) {
                *value_len = integer_lyb_size[value->realtype->basetype];
            }
            return &value->uint64;
        } else {
            /* values differ, big-endian */
            buf = calloc(1, integer_lyb_size[value->realtype->basetype]);
            LY_CHECK_RET(!buf, NULL);

            *dynamic = 1;
            if (value_len) {
                *value_len = integer_lyb_size[value->realtype->basetype];
            }
            memcpy(buf, &num, integer_lyb_size[value->realtype->basetype]);
            return buf;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}